

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flash.h
# Opt level: O3

void __thiscall Flash::~Flash(Flash *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_Flash = (_func_int **)&PTR__Flash_00118158;
  (this->_regions)._vptr_FlashOption = (_func_int **)&PTR__FlashOption_00118298;
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->_regions)._value.super__Bvector_base<std::allocator<bool>_>);
  WordCopyApplet::~WordCopyApplet(&this->_wordCopy);
  pcVar1 = (this->_name)._M_dataplus._M_p;
  paVar2 = &(this->_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~Flash() {}